

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::GetIDType(SQLexer *this,SQChar *s,SQInteger len)

{
  SQUnsignedInteger *pSVar1;
  int iVar2;
  SQObjectValue *pSVar3;
  ulong uVar4;
  SQObjectValue SVar5;
  ulong uVar6;
  _HashNode *p_Var7;
  SQObjectPtr t;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_20.super_SQObject._type = OT_NULL;
  if (len == 0) {
    len = 0;
  }
  else {
    uVar6 = (ulong)len >> 5;
    uVar4 = len;
    do {
      len = len ^ (ulong)(ushort)(short)s[uVar4 - 1] + ((ulong)len >> 2) + len * 0x20;
      uVar4 = uVar4 + ~uVar6;
    } while (uVar6 < uVar4);
  }
  p_Var7 = this->_keywords->_nodes + (this->_keywords->_numofnodes - 1U & len);
  do {
    if (((p_Var7->key).super_SQObject._type == OT_STRING) &&
       (iVar2 = strcmp((char *)&((p_Var7->key).super_SQObject._unVal.pOuter)->_idx,s), iVar2 == 0))
    goto LAB_00117c26;
    p_Var7 = p_Var7->next;
  } while (p_Var7 != (_HashNode *)0x0);
  p_Var7 = (_HashNode *)0x0;
LAB_00117c26:
  if (p_Var7 != (_HashNode *)0x0) {
    local_20.super_SQObject._type = (p_Var7->val).super_SQObject._type;
    pSVar3 = &(p_Var7->val).super_SQObject._unVal;
    if (local_20.super_SQObject._type == OT_WEAKREF) {
      local_20.super_SQObject._type = *(SQObjectType *)&pSVar3->pString->_sharedstate;
      pSVar3 = (SQObjectValue *)&pSVar3->pString->_next;
    }
    local_20.super_SQObject._unVal.pWeakRef = (SQWeakRef *)pSVar3->pTable;
    if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
  }
  SVar5.nInteger = 0x102;
  if (p_Var7 != (_HashNode *)0x0) {
    SVar5 = local_20.super_SQObject._unVal;
  }
  SQObjectPtr::~SQObjectPtr(&local_20);
  return (SQInteger)SVar5.pTable;
}

Assistant:

SQInteger SQLexer::GetIDType(const SQChar *s,SQInteger len)
{
    SQObjectPtr t;
    if(_keywords->GetStr(s,len, t)) {
        return SQInteger(_integer(t));
    }
    return TK_IDENTIFIER;
}